

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_elements_output_commitment_init
              (wally_tx_output *output,uchar *asset,size_t asset_len,uchar *value,size_t value_len,
              uchar *nonce,size_t nonce_len,uchar *surjectionproof,size_t surjectionproof_len,
              uchar *rangeproof,size_t rangeproof_len,_Bool is_elements)

{
  int iVar1;
  uchar *__dest;
  uchar *__dest_00;
  bool bVar2;
  uchar *local_48;
  
  iVar1 = -2;
  if ((((output != (wally_tx_output *)0x0) && ((asset != (uchar *)0x0) != (asset_len != 0x21))) &&
      ((value != (uchar *)0x0) != (value_len != 9 && value_len != 0x21))) &&
     ((((nonce != (uchar *)0x0) != (nonce_len != 0x21) &&
       ((surjectionproof != (uchar *)0x0) != (surjectionproof_len == 0))) &&
      ((rangeproof != (uchar *)0x0) != (rangeproof_len == 0))))) {
    if (asset_len == 0) {
      bVar2 = true;
      __dest = (uchar *)0x0;
    }
    else {
      __dest = (uchar *)wally_malloc(asset_len);
      if (__dest != (uchar *)0x0) {
        memcpy(__dest,asset,asset_len);
      }
      bVar2 = __dest != (uchar *)0x0;
    }
    iVar1 = -3;
    if (bVar2) {
      if (value_len == 0) {
        bVar2 = true;
        local_48 = (uchar *)0x0;
      }
      else {
        local_48 = (uchar *)wally_malloc(value_len);
        if (local_48 != (uchar *)0x0) {
          memcpy(local_48,value,value_len);
        }
        bVar2 = local_48 != (uchar *)0x0;
      }
      if (bVar2) {
        if (nonce_len == 0) {
          bVar2 = true;
          __dest_00 = (uchar *)0x0;
        }
        else {
          __dest_00 = (uchar *)wally_malloc(nonce_len);
          if (__dest_00 != (uchar *)0x0) {
            memcpy(__dest_00,nonce,nonce_len);
          }
          bVar2 = __dest_00 != (uchar *)0x0;
        }
        if (bVar2) {
          iVar1 = tx_elements_output_proof_init
                            (output,surjectionproof,surjectionproof_len,rangeproof,rangeproof_len);
        }
      }
      else {
        __dest_00 = (uchar *)0x0;
      }
    }
    else {
      local_48 = (uchar *)0x0;
      __dest_00 = (uchar *)0x0;
    }
    if (iVar1 == 0) {
      output->asset = __dest;
      output->asset_len = asset_len;
      output->value = local_48;
      output->value_len = value_len;
      output->nonce = __dest_00;
      output->nonce_len = nonce_len;
      iVar1 = 0;
      if (is_elements) {
        output->features = output->features | 1;
      }
    }
    else {
      clear_and_free(__dest,asset_len);
      clear_and_free(local_48,value_len);
      clear_and_free(__dest_00,nonce_len);
    }
  }
  return iVar1;
}

Assistant:

static int tx_elements_output_commitment_init(
    struct wally_tx_output *output,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len,
    bool is_elements)
{
#ifdef BUILD_ELEMENTS
    int ret;
    unsigned char *new_asset = NULL, *new_value = NULL, *new_nonce = NULL;
#endif

    if (!output ||
        BYTES_INVALID_N(asset, asset_len, WALLY_TX_ASSET_CT_ASSET_LEN) ||
        ((value != NULL) != (value_len == WALLY_TX_ASSET_CT_VALUE_LEN ||
                             value_len == WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN)) ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_CT_NONCE_LEN) ||
        BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_asset, asset, asset_len) ||
        !clone_bytes(&new_value, value, value_len) ||
        !clone_bytes(&new_nonce, nonce, nonce_len))
        ret = WALLY_ENOMEM;
    else
        ret = tx_elements_output_proof_init(output,
                                            surjectionproof,
                                            surjectionproof_len,
                                            rangeproof,
                                            rangeproof_len);
    if (ret != WALLY_OK) {
        clear_and_free(new_asset, asset_len);
        clear_and_free(new_value, value_len);
        clear_and_free(new_nonce, nonce_len);
        return ret;
    }

    output->asset = new_asset;
    output->asset_len = asset_len;
    output->value = new_value;
    output->value_len = value_len;
    output->nonce = new_nonce;
    output->nonce_len = nonce_len;
#endif /* BUILD_ELEMENTS */

    if (is_elements)
        output->features |= WALLY_TX_IS_ELEMENTS;

    return WALLY_OK;
}